

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::DeepScanLineInputFile::multiPartInitialize(DeepScanLineInputFile *this,InputPartData *part)

{
  InputStreamMutex *pIVar1;
  Data *pDVar2;
  int iVar3;
  
  pIVar1 = part->mutex;
  this->_data->_streamData = pIVar1;
  iVar3 = (*pIVar1->is->_vptr_IStream[2])();
  pDVar2 = this->_data;
  pDVar2->memoryMapped = SUB41(iVar3,0);
  pDVar2->version = part->version;
  initialize(this,&part->header);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->_data->lineOffsets,&part->chunkOffsets);
  this->_data->partNumber = part->partNumber;
  return;
}

Assistant:

void
DeepScanLineInputFile::multiPartInitialize (InputPartData* part)
{

    _data->_streamData  = part->mutex;
    _data->memoryMapped = _data->_streamData->is->isMemoryMapped ();
    _data->version      = part->version;

    initialize (part->header);

    _data->lineOffsets = part->chunkOffsets;

    _data->partNumber = part->partNumber;
}